

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_effect.cpp
# Opt level: O3

void P_RunEffect(AActor *actor,int effects)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  uint uVar12;
  uint uVar13;
  particle_t *ppVar14;
  int *piVar15;
  ulong uVar16;
  int iVar17;
  bool bVar18;
  DVector2 v;
  DVector3 local_68;
  DAngle local_50;
  DAngle local_48;
  DAngle local_40;
  DAngle local_38;
  
  dVar6 = c_atan2((actor->Vel).Y,(actor->Vel).X);
  dVar6 = dVar6 * 57.29577951308232;
  if (((effects & 1U) != 0) && (((byte)cl_rockettrails.Value & 1) != 0)) {
    dVar1 = actor->radius;
    dVar7 = FFastTrig::cos(&fasttrig,dVar6 * 11930464.711111112 + 6755399441055744.0);
    dVar7 = dVar7 * dVar1 * -2.0;
    dVar1 = actor->radius * -2.0;
    dVar8 = FFastTrig::sin(&fasttrig,dVar1);
    dVar8 = dVar8 * dVar1;
    dVar1 = ((actor->Vel).Z * -0.125 + 0.6666666666666666) * actor->Height;
    uVar12 = FRandom::GenRand32(&M_Random);
    ppVar14 = JitterParticle((uVar12 & 0x1f) + 3,1.0);
    if (ppVar14 != (particle_t *)0x0) {
      uVar12 = FRandom::GenRand32(&M_Random);
      dVar9 = (double)(uVar12 & 0xff) * 0.00390625;
      dVar2 = (actor->Vel).Z;
      P_GetOffsetPosition((actor->__Pos).X,(actor->__Pos).Y,dVar7 - (actor->Vel).X * dVar9,
                          dVar8 - (actor->Vel).Y * dVar9);
      (ppVar14->Pos).Z = (dVar1 - dVar9 * dVar2) + (actor->__Pos).Z;
      (ppVar14->Pos).X = local_68.X;
      (ppVar14->Pos).Y = local_68.Y;
      uVar12 = FRandom::GenRand32(&M_Random);
      dVar2 = (double)(int)((uVar12 & 0xff) - 0x80) * 0.005;
      dVar9 = FFastTrig::cos(&fasttrig,(dVar6 + 90.0) * 11930464.711111112 + 6755399441055744.0);
      dVar9 = dVar9 * dVar2 + (ppVar14->Vel).X;
      (ppVar14->Vel).X = dVar9;
      dVar9 = FFastTrig::sin(&fasttrig,dVar9);
      dVar2 = dVar9 * dVar2 + (ppVar14->Vel).Y;
      dVar9 = (ppVar14->Vel).Z + -0.027777777777777776;
      auVar5._8_4_ = SUB84(dVar9,0);
      auVar5._0_8_ = dVar2;
      auVar5._12_4_ = (int)((ulong)dVar9 >> 0x20);
      (ppVar14->Vel).Y = dVar2;
      (ppVar14->Vel).Z = (double)auVar5._8_8_;
      (ppVar14->Acc).Z = (ppVar14->Acc).Z + -0.05;
      ppVar14->color = yellow;
      ppVar14->size = 2.0;
    }
    iVar17 = -6;
    do {
      uVar12 = FRandom::GenRand32(&M_Random);
      ppVar14 = JitterParticle((uVar12 & 0x1f) + 3,1.0);
      if (ppVar14 == (particle_t *)0x0) break;
      uVar12 = FRandom::GenRand32(&M_Random);
      dVar10 = (double)(uVar12 & 0xff) * 0.00390625;
      dVar2 = (actor->Vel).X;
      dVar9 = (actor->Vel).Y;
      dVar3 = (actor->Vel).Z;
      uVar12 = FRandom::GenRand32(&M_Random);
      P_GetOffsetPosition((actor->__Pos).X,(actor->__Pos).Y,dVar7 - dVar2 * dVar10,
                          dVar8 - dVar9 * dVar10);
      (ppVar14->Pos).Z =
           (double)(uVar12 & 0xff) * 0.015625 + (dVar1 - dVar10 * dVar3) + (actor->__Pos).Z;
      (ppVar14->Pos).X = local_68.X;
      (ppVar14->Pos).Y = local_68.Y;
      uVar12 = FRandom::GenRand32(&M_Random);
      dVar2 = (double)(int)((uVar12 & 0xff) - 0x80) * 0.005;
      dVar9 = FFastTrig::cos(&fasttrig,dVar2);
      dVar9 = dVar9 * dVar2 + (ppVar14->Vel).X;
      (ppVar14->Vel).X = dVar9;
      dVar9 = FFastTrig::sin(&fasttrig,dVar9);
      dVar2 = (ppVar14->Vel).Y + dVar9 * dVar2;
      dVar9 = (ppVar14->Vel).Z + 0.0125;
      auVar11._8_4_ = SUB84(dVar9,0);
      auVar11._0_8_ = dVar2;
      auVar11._12_4_ = (int)((ulong)dVar9 >> 0x20);
      (ppVar14->Vel).Y = dVar2;
      (ppVar14->Vel).Z = (double)auVar11._8_8_;
      (ppVar14->Acc).Z = (ppVar14->Acc).Z + 0.025;
      uVar12 = FRandom::GenRand32(&M_Random);
      piVar15 = &grey2;
      if ((uVar12 & 7) == 0) {
        piVar15 = &grey1;
      }
      ppVar14->color = *piVar15;
      ppVar14->size = 3.0;
      iVar17 = iVar17 + 1;
    } while (iVar17 != 0);
  }
  if (((effects & 2U) != 0) && (((byte)cl_rockettrails.Value & 1) != 0)) {
    local_40.Degrees = dVar6;
    AActor::Vec3Angle(&local_68,actor,actor->radius * -2.0,&local_40,
                      actor->Height * 0.6666666666666666 + (actor->Vel).Z * actor->Height * -0.125,
                      false);
    local_48.Degrees = dVar6 + 180.0;
    P_DrawSplash2(6,&local_68,&local_48,2,2);
  }
  if (((effects & 0x70000U) != 0) && (((byte)level.time & 1) != 0)) {
    uVar16 = (ulong)((effects & 0x70000U) >> 0xc);
    iVar17 = **(int **)((long)P_RunEffect::fountainColors + uVar16);
    iVar4 = **(int **)((long)P_RunEffect::fountainColors + uVar16 + 8);
    ppVar14 = JitterParticle(0x33,1.0);
    if (ppVar14 != (particle_t *)0x0) {
      uVar12 = FRandom::GenRand32(&M_Random);
      dVar6 = actor->radius;
      uVar13 = FRandom::GenRand32(&M_Random);
      dVar6 = (double)(uVar13 & 0xff) * dVar6 * 0.00390625;
      local_38.Degrees = (double)(uVar12 & 0xff) * 1.40625;
      AActor::Vec3Angle(&local_68,actor,dVar6,&local_38,actor->Height + 1.0,false);
      (ppVar14->Pos).Z = local_68.Z;
      (ppVar14->Pos).X = local_68.X;
      (ppVar14->Pos).Y = local_68.Y;
      (ppVar14->Vel).Z =
           (ppVar14->Vel).Z +
           *(double *)(&DAT_00765810 + (ulong)(dVar6 < actor->radius * 0.125) * 8);
      (ppVar14->Acc).Z = (ppVar14->Acc).Z + -0.09090909090909091;
      uVar12 = FRandom::GenRand32(&M_Random);
      bVar18 = (uVar12 & 0xfe) < 0x1e;
      if (bVar18) {
        iVar17 = iVar4;
      }
      ppVar14->size = *(double *)(&DAT_00765820 + (ulong)bVar18 * 8);
      ppVar14->color = iVar17;
    }
  }
  if ((effects & 0x20U) != 0) {
    uVar12 = 4;
    do {
      ppVar14 = JitterParticle(0x10,1.0);
      if (ppVar14 != (particle_t *)0x0) {
        uVar13 = FRandom::GenRand32(&M_Random);
        local_50.Degrees = (double)(uVar13 & 0xff) * 1.40625;
        AActor::Vec3Angle(&local_68,actor,actor->radius,&local_50,0.0,false);
        (ppVar14->Pos).Z = local_68.Z;
        (ppVar14->Pos).X = local_68.X;
        (ppVar14->Pos).Y = local_68.Y;
        uVar13 = FRandom::GenRand32(&M_Random);
        ppVar14->color = *P_RunEffect::protectColors[uVar13 & 1];
        (ppVar14->Vel).Z = 1.0;
        uVar13 = FRandom::GenRand32(&M_Random);
        (ppVar14->Acc).Z = (double)(uVar13 & 0xff) * 0.001953125;
        ppVar14->size = 1.0;
        uVar13 = FRandom::GenRand32(&M_Random);
        if (-1 < (char)uVar13) {
          (ppVar14->Pos).Z = actor->Height + (ppVar14->Pos).Z;
          (ppVar14->Vel).Z = -(ppVar14->Vel).Z;
          (ppVar14->Acc).Z = -(ppVar14->Acc).Z;
        }
      }
      uVar12 = uVar12 - 1;
    } while (1 < uVar12);
  }
  return;
}

Assistant:

void P_RunEffect (AActor *actor, int effects)
{
	DAngle moveangle = actor->Vel.Angle();

	particle_t *particle;
	int i;

	if ((effects & FX_ROCKET) && (cl_rockettrails & 1))
	{
		// Rocket trail
		double backx = -actor->radius * 2 * moveangle.Cos();
		double backy = -actor->radius * 2 * moveangle.Sin();
		double backz = actor->Height * ((2. / 3) - actor->Vel.Z / 8);

		DAngle an = moveangle + 90.;
		double speed;

		particle = JitterParticle (3 + (M_Random() & 31));
		if (particle) {
			double pathdist = M_Random() / 256.;
			DVector3 pos = actor->Vec3Offset(
				backx - actor->Vel.X * pathdist,
				backy - actor->Vel.Y * pathdist,
				backz - actor->Vel.Z * pathdist);
			particle->Pos = pos;
			speed = (M_Random () - 128) * (1./200);
			particle->Vel.X += speed * an.Cos();
			particle->Vel.Y += speed * an.Sin();
			particle->Vel.Z -= 1./36;
			particle->Acc.Z -= 1./20;
			particle->color = yellow;
			particle->size = 2;
		}
		for (i = 6; i; i--) {
			particle_t *particle = JitterParticle (3 + (M_Random() & 31));
			if (particle) {
				double pathdist = M_Random() / 256.;
				DVector3 pos = actor->Vec3Offset(
					backx - actor->Vel.X * pathdist,
					backy - actor->Vel.Y * pathdist,
					backz - actor->Vel.Z * pathdist + (M_Random() / 64.));
				particle->Pos = pos;

				speed = (M_Random () - 128) * (1./200);
				particle->Vel.X += speed * an.Cos();
				particle->Vel.Y += speed * an.Sin();
				particle->Vel.Z += 1. / 80;
				particle->Acc.Z += 1. / 40;
				if (M_Random () & 7)
					particle->color = grey2;
				else
					particle->color = grey1;
				particle->size = 3;
			} else
				break;
		}
	}
	if ((effects & FX_GRENADE) && (cl_rockettrails & 1))
	{
		// Grenade trail

		DVector3 pos = actor->Vec3Angle(-actor->radius * 2, moveangle, -actor->Height * actor->Vel.Z / 8 + actor->Height * (2. / 3));

		P_DrawSplash2 (6, pos, moveangle + 180, 2, 2);
	}
	if (effects & FX_FOUNTAINMASK)
	{
		// Particle fountain

		static const int *fountainColors[16] = 
			{ &black,	&black,
			  &red,		&red1,
			  &green,	&green1,
			  &blue,	&blue1,
			  &yellow,	&yellow1,
			  &purple,	&purple1,
			  &black,	&grey3,
			  &grey4,	&white
			};
		int color = (effects & FX_FOUNTAINMASK) >> 15;
		MakeFountain (actor, *fountainColors[color], *fountainColors[color+1]);
	}
	if (effects & FX_RESPAWNINVUL)
	{
		// Respawn protection

		static const int *protectColors[2] = { &yellow1, &white };

		for (i = 3; i > 0; i--)
		{
			particle = JitterParticle (16);
			if (particle != NULL)
			{
				DAngle ang = M_Random() * (360 / 256.);
				DVector3 pos = actor->Vec3Angle(actor->radius, ang, 0);
				particle->Pos = pos;
				particle->color = *protectColors[M_Random() & 1];
				particle->Vel.Z = 1;
				particle->Acc.Z = M_Random () / 512.;
				particle->size = 1;
				if (M_Random () < 128)
				{ // make particle fall from top of actor
					particle->Pos.Z += actor->Height;
					particle->Vel.Z = -particle->Vel.Z;
					particle->Acc.Z = -particle->Acc.Z;
				}
			}
		}
	}
}